

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

void __thiscall
cfd::core::HDWallet::HDWallet
          (HDWallet *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *mnemonic,string *passphrase,bool use_ideographic_space)

{
  size_t sVar1;
  CfdException *this_00;
  allocator local_41;
  string local_40;
  
  ::std::__cxx11::string::string
            ((string *)&local_40,
             "00000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000"
             ,&local_41);
  ByteData::ByteData(&this->seed_,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  WallyUtil::ConvertMnemonicToSeed((ByteData *)&local_40,mnemonic,passphrase,use_ideographic_space);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&local_40);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  sVar1 = ByteData::GetDataSize(&this->seed_);
  if (sVar1 != 0x10) {
    sVar1 = ByteData::GetDataSize(&this->seed_);
    if (sVar1 != 0x20) {
      sVar1 = ByteData::GetDataSize(&this->seed_);
      if (sVar1 != 0x40) {
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)&local_40,"Seed length error.",&local_41);
        CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_40);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  return;
}

Assistant:

HDWallet::HDWallet(
    std::vector<std::string> mnemonic, std::string passphrase,
    bool use_ideographic_space)
    : seed_(ByteData(kEmptySeedStr)) {
  seed_ = ConvertMnemonicToSeed(mnemonic, passphrase, use_ideographic_space);
  if ((seed_.GetDataSize() != HDWallet::kSeed128Size) &&
      (seed_.GetDataSize() != HDWallet::kSeed256Size) &&
      (seed_.GetDataSize() != HDWallet::kSeed512Size)) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Seed length error.");
  }
}